

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_LongDoubleNear_Test::Body
          (iu_MatcherFailure_x_iutest_x_LongDoubleNear_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard_1;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  iuCodeMessage local_268;
  AssertionResult iutest_spi_ar;
  string local_210;
  string local_1f0;
  AssertionResult iutest_ar;
  undefined1 local_1a8 [32];
  longdouble local_188;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1a8._0_8_ = &PTR__IMatcher_00223ee8;
  local_1a8._26_6_ = 0;
  local_1a8._16_8_ = SUB108((longdouble)1,0);
  local_1a8._24_2_ = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
  local_188 = (longdouble)(anonymous_namespace)::ld0._0_10_;
  iutest::detail::FloatingPointNearMatcher<long_double>::operator()
            (&iutest_ar,(FloatingPointNearMatcher<long_double> *)local_1a8,
             (longdouble *)(anonymous_namespace)::ld0);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::PrintToString<long_double>(&local_210,(longdouble *)(anonymous_namespace)::ld0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(detail *)local_210._M_dataplus._M_p,"LongDoubleNear(1.0l, ld0)",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x21f,local_1f0._M_dataplus._M_p);
    local_268._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1.super_ScopedGuard.m_test_flags = guard.super_ScopedGuard.m_test_flags;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"Near: ",(allocator<char> *)&local_268);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x21f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_1);
  local_268.m_message._0_10_ = (longdouble)0 / (longdouble)(anonymous_namespace)::ld0._0_10_;
  local_1a8._0_8_ = &PTR__IMatcher_00223ee8;
  local_1a8._26_6_ = 0;
  local_1a8._16_8_ = (undefined8)local_268.m_message._0_10_;
  local_1a8._24_2_ = (undefined2)((unkuint10)local_268.m_message._0_10_ >> 0x40);
  local_188 = (longdouble)1;
  iutest::detail::FloatingPointNearMatcher<long_double>::operator()
            (&iutest_ar,(FloatingPointNearMatcher<long_double> *)local_1a8,(longdouble *)&local_268)
  ;
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    _guard = (longdouble)0 / (longdouble)(anonymous_namespace)::ld0._0_10_;
    iutest::PrintToString<long_double>(&local_210,(longdouble *)&guard);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(detail *)local_210._M_dataplus._M_p,"LongDoubleNear(0/ld0, 1.0l)",
               (char *)&iutest_ar,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x220,local_1f0._M_dataplus._M_p);
    local_268._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_268,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard_1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"Near: ",(allocator<char> *)&local_268);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x220,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, LongDoubleNear)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(ld0, LongDoubleNear(1.0l, ld0)), "Near: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0/ld0, LongDoubleNear(0/ld0, 1.0l)), "Near: " );
}